

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

_Bool VectorInsideTriangle2D(Vector v,Vector v1,Vector v2,Vector v3)

{
  byte bVar1;
  undefined8 in_stack_00000008;
  undefined1 local_55;
  Real c;
  Real b;
  Real a;
  int8_t sign;
  
  bVar1 = -((longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) * (longdouble)v3._8_10_ +
            (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_) * (longdouble)v2._8_10_ +
            (longdouble)v1._8_10_ * (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) <
           (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_) * (longdouble)v3._8_10_ +
           (longdouble)v1._8_10_ * (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) +
           (longdouble)v2._8_10_ * (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_)) | 1;
  local_55 = false;
  if ((longdouble)0 <
      (longdouble)(int)(char)bVar1 *
      ((((longdouble)v1._8_10_ *
         ((longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) -
         (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008)) +
        (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008) * (longdouble)v3._8_10_) -
       (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) * (longdouble)v._8_10_) +
      (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_) * ((longdouble)v._8_10_ - (longdouble)v3._8_10_)))
  {
    local_55 = false;
    if ((longdouble)(int)(char)bVar1 *
        ((((longdouble)v1._8_10_ *
           ((longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) -
           (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008)) +
          (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008) * (longdouble)v2._8_10_) -
         (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) * (longdouble)v._8_10_) +
        (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_) * ((longdouble)v._8_10_ - (longdouble)v2._8_10_))
        < (longdouble)0) {
      local_55 = (longdouble)(int)(char)bVar1 *
                 ((((longdouble)v2._8_10_ *
                    ((longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) -
                    (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008)) +
                   (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008) * (longdouble)v3._8_10_) -
                  (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) * (longdouble)v._8_10_) +
                 (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) *
                 ((longdouble)v._8_10_ - (longdouble)v3._8_10_)) < (longdouble)0;
    }
  }
  return local_55;
}

Assistant:

bool VectorInsideTriangle2D(const Vector v, const Vector v1, const Vector v2, const Vector v3) {
  int8_t sign = v1.x * v2.y + v1.y * v3.x + v2.x * v3.y < v1.y * v2.x + v2.y * v3.x + v1.x * v3.y ? -1 : 1;
  Real a = (v1.y * (v3.x - v.x) + v3.y * v.x - v3.x * v.y + v1.x * (-v3.y + v.y));
  Real b = (v1.y * (v2.x - v.x) + v2.y * v.x - v2.x * v.y + v1.x * (-v2.y + v.y));
  Real c = (v2.y * (v3.x - v.x) + v3.y * v.x - v3.x * v.y + v2.x * (-v3.y + v.y));
  return a * sign > 0 && b * sign < 0 && c * sign < 0;
}